

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_state.cpp
# Opt level: O3

void __thiscall
lzham::lzcompressor::coding_stats::update
          (coding_stats *this,lzdecision *lzdec,state *cur_state,search_accelerator *dict,
          bit_cost_t cost)

{
  int *piVar1;
  double *pdVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  uint uVar5;
  uint uVar6;
  uchar *puVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double dVar15;
  double dVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  double dVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  double dVar35;
  
  uVar3 = this->m_total_bytes;
  uVar4 = this->m_total_contexts;
  this->m_total_bytes = lzdec->m_len + (uint)(lzdec->m_len == 0) + uVar3;
  this->m_total_contexts = uVar4 + 1;
  dVar15 = (double)((float)cost * 5.9604645e-08);
  this->m_total_cost = this->m_total_cost + dVar15;
  (this->m_context_stats).m_num = (this->m_context_stats).m_num + 1;
  (this->m_context_stats).m_total = (this->m_context_stats).m_total + dVar15;
  dVar35 = dVar15 * dVar15;
  (this->m_context_stats).m_total2 = (this->m_context_stats).m_total2 + dVar35;
  dVar16 = (this->m_context_stats).m_min_val;
  dVar27 = (this->m_context_stats).m_max_val;
  uVar24 = -(ulong)(dVar16 < dVar15);
  uVar25 = -(ulong)(dVar27 < dVar15);
  uVar23 = (ulong)dVar15 & uVar25;
  auVar28._0_8_ = ~uVar24 & (ulong)dVar15;
  auVar28._8_8_ = ~uVar25 & (ulong)dVar27;
  auVar8._8_4_ = (int)uVar23;
  auVar8._0_8_ = (ulong)dVar16 & uVar24;
  auVar8._12_4_ = (int)(uVar23 >> 0x20);
  (this->m_context_stats).m_min_val = (double)SUB168(auVar28 | auVar8,0);
  (this->m_context_stats).m_max_val = (double)SUB168(auVar28 | auVar8,8);
  uVar5 = (cur_state->super_state_base).m_cur_state;
  uVar19 = lzdec->m_len;
  uVar23 = (ulong)uVar19;
  if (uVar23 == 0) {
    dVar27 = (double)((float)*(uint *)((long)&g_prob_cost +
                                      (ulong)cur_state->m_is_match_model[uVar5].m_bit_0_prob * 4) *
                     5.9604645e-08);
    this->m_total_is_match0_bits_cost = this->m_total_is_match0_bits_cost + dVar27;
    this->m_total_match_bits_cost = this->m_total_match_bits_cost + dVar27;
    dVar16 = this->m_worst_match_bits_cost;
    if (this->m_worst_match_bits_cost <= dVar27) {
      dVar16 = dVar27;
    }
    this->m_worst_match_bits_cost = dVar16;
    this->m_total_nonmatches = this->m_total_nonmatches + 1;
    if ((cur_state->super_state_base).m_cur_state < 7) {
      (this->m_lit_stats).m_num = (this->m_lit_stats).m_num + 1;
      (this->m_lit_stats).m_total = (this->m_lit_stats).m_total + dVar15;
      (this->m_lit_stats).m_total2 = dVar35 + (this->m_lit_stats).m_total2;
      dVar16 = (this->m_lit_stats).m_min_val;
      dVar27 = (this->m_lit_stats).m_max_val;
      uVar24 = -(ulong)(dVar16 < dVar15);
      uVar25 = -(ulong)(dVar27 < dVar15);
      uVar23 = (ulong)dVar15 & uVar25;
      auVar29._0_8_ = ~uVar24 & (ulong)dVar15;
      auVar29._8_8_ = ~uVar25 & (ulong)dVar27;
      auVar13._8_4_ = (int)uVar23;
      auVar13._0_8_ = (ulong)dVar16 & uVar24;
      auVar13._12_4_ = (int)(uVar23 >> 0x20);
      (this->m_lit_stats).m_min_val = (double)SUB168(auVar29 | auVar13,0);
      (this->m_lit_stats).m_max_val = (double)SUB168(auVar29 | auVar13,8);
      return;
    }
    (this->m_delta_lit_stats).m_num = (this->m_delta_lit_stats).m_num + 1;
    (this->m_delta_lit_stats).m_total = (this->m_delta_lit_stats).m_total + dVar15;
    (this->m_delta_lit_stats).m_total2 = dVar35 + (this->m_delta_lit_stats).m_total2;
    dVar16 = (this->m_delta_lit_stats).m_min_val;
    dVar27 = (this->m_delta_lit_stats).m_max_val;
    uVar24 = -(ulong)(dVar16 < dVar15);
    uVar25 = -(ulong)(dVar27 < dVar15);
    uVar23 = (ulong)dVar15 & uVar25;
    auVar30._0_8_ = ~uVar24 & (ulong)dVar15;
    auVar30._8_8_ = ~uVar25 & (ulong)dVar27;
    auVar14._8_4_ = (int)uVar23;
    auVar14._0_8_ = (ulong)dVar16 & uVar24;
    auVar14._12_4_ = (int)(uVar23 >> 0x20);
    (this->m_delta_lit_stats).m_min_val = (double)SUB168(auVar30 | auVar14,0);
    (this->m_delta_lit_stats).m_max_val = (double)SUB168(auVar30 | auVar14,8);
    return;
  }
  if (0x101 < (int)uVar19) {
    return;
  }
  uVar21 = 0;
  if ((0 < (int)uVar19) && (uVar21 = lzdec->m_dist, (int)uVar21 < 0)) {
    uVar21 = (cur_state->super_state_base).m_match_hist[~uVar21];
  }
  uVar6 = dict->m_lookahead_size;
  uVar18 = 0x101;
  if (uVar6 < 0x101) {
    uVar18 = uVar6;
  }
  uVar17 = 0;
  if (((int)uVar21 <= (int)dict->m_cur_dict_size) && (uVar6 != 0)) {
    puVar7 = (dict->m_dict).m_p;
    uVar24 = 0;
    do {
      if (puVar7[uVar24 + (dict->m_lookahead_pos - uVar21 & dict->m_max_dict_size_mask)] !=
          puVar7[uVar24 + (dict->m_max_dict_size_mask & dict->m_lookahead_pos)]) {
        uVar18 = (uint)uVar24;
        break;
      }
      uVar24 = uVar24 + 1;
    } while (uVar18 != uVar24);
    uVar17 = uVar18;
    if (uVar19 <= uVar18) goto LAB_0010dfa9;
  }
  uVar18 = uVar17;
  lzham_assert("match_len <= actual_match_len",
               "/workspace/llm4binary/github/license_c_cmakelists/richgel999[P]lzham_codec_devel/lzhamcomp/lzham_lzcomp_state.cpp"
               ,0x64d);
LAB_0010dfa9:
  uVar21 = uVar18 - uVar19;
  this->m_total_truncated_matches =
       this->m_total_truncated_matches + (uint)(uVar19 <= uVar18 && uVar21 != 0);
  uVar24 = 0;
  if (0 < (int)uVar21) {
    uVar24 = (ulong)uVar21;
  }
  this->m_match_truncation_len_hist[uVar24] = this->m_match_truncation_len_hist[uVar24] + 1;
  uVar25 = (ulong)(uint)~lzdec->m_dist;
  uVar24 = 4;
  if (lzdec->m_dist < 1) {
    uVar24 = uVar25;
  }
  if (lzdec->m_len < 1) {
    uVar24 = uVar25;
  }
  lVar22 = 0x95c;
  if (uVar19 < uVar18) {
    this->m_match_truncation_hist[uVar23] = this->m_match_truncation_hist[uVar23] + 1;
    lVar22 = 0x86c;
  }
  piVar1 = (int *)((long)this->m_match_truncation_len_hist +
                  uVar24 * 4 + (ulong)(cur_state->super_state_base).m_cur_state * 0x14 + lVar22 +
                  -0x5c);
  *piVar1 = *piVar1 + 1;
  dVar27 = (double)((float)*(uint *)((long)&g_prob_cost +
                                    (ulong)(0x800 - cur_state->m_is_match_model[uVar5].m_bit_0_prob)
                                    * 4) * 5.9604645e-08);
  this->m_total_is_match1_bits_cost = this->m_total_is_match1_bits_cost + dVar27;
  this->m_total_match_bits_cost = this->m_total_match_bits_cost + dVar27;
  dVar16 = this->m_worst_match_bits_cost;
  if (this->m_worst_match_bits_cost <= dVar27) {
    dVar16 = dVar27;
  }
  this->m_worst_match_bits_cost = dVar16;
  this->m_total_matches = this->m_total_matches + 1;
  uVar5 = lzdec->m_dist;
  if ((int)uVar5 < 0) {
    uVar19 = ~uVar5;
    this->m_rep_stats[uVar19].m_num = this->m_rep_stats[uVar19].m_num + 1;
    this->m_rep_stats[uVar19].m_total = this->m_rep_stats[uVar19].m_total + dVar15;
    this->m_rep_stats[uVar19].m_total2 = this->m_rep_stats[uVar19].m_total2 + dVar35;
    pdVar2 = &this->m_rep_stats[uVar19].m_min_val;
    dVar16 = *pdVar2;
    dVar27 = pdVar2[1];
    uVar24 = -(ulong)(dVar16 < dVar15);
    uVar25 = -(ulong)(dVar27 < dVar15);
    uVar23 = (ulong)dVar15 & uVar25;
    auVar32._0_8_ = ~uVar24 & (ulong)dVar15;
    auVar32._8_8_ = ~uVar25 & (ulong)dVar27;
    auVar10._8_4_ = (int)uVar23;
    auVar10._0_8_ = (ulong)dVar16 & uVar24;
    auVar10._12_4_ = (int)(uVar23 >> 0x20);
    this->m_rep_stats[uVar19].m_min_val = (double)SUB168(auVar32 | auVar10,0);
    this->m_rep_stats[uVar19].m_max_val = (double)SUB168(auVar32 | auVar10,8);
    if (uVar5 == 0xffffffff) {
      if (lzdec->m_len == 1) {
        (this->m_rep0_len1_stats).m_num = (this->m_rep0_len1_stats).m_num + 1;
        (this->m_rep0_len1_stats).m_total = (this->m_rep0_len1_stats).m_total + dVar15;
        (this->m_rep0_len1_stats).m_total2 = dVar35 + (this->m_rep0_len1_stats).m_total2;
        dVar16 = (this->m_rep0_len1_stats).m_min_val;
        dVar27 = (this->m_rep0_len1_stats).m_max_val;
        uVar24 = -(ulong)(dVar16 < dVar15);
        uVar25 = -(ulong)(dVar27 < dVar15);
        uVar23 = (ulong)dVar15 & uVar25;
        auVar33._0_8_ = ~uVar24 & (ulong)dVar15;
        auVar33._8_8_ = ~uVar25 & (ulong)dVar27;
        auVar11._8_4_ = (int)uVar23;
        auVar11._0_8_ = (ulong)dVar16 & uVar24;
        auVar11._12_4_ = (int)(uVar23 >> 0x20);
        (this->m_rep0_len1_stats).m_min_val = (double)SUB168(auVar33 | auVar11,0);
        (this->m_rep0_len1_stats).m_max_val = (double)SUB168(auVar33 | auVar11,8);
      }
      else {
        (this->m_rep0_len2_plus_stats).m_num = (this->m_rep0_len2_plus_stats).m_num + 1;
        (this->m_rep0_len2_plus_stats).m_total = (this->m_rep0_len2_plus_stats).m_total + dVar15;
        (this->m_rep0_len2_plus_stats).m_total2 = dVar35 + (this->m_rep0_len2_plus_stats).m_total2;
        dVar16 = (this->m_rep0_len2_plus_stats).m_min_val;
        dVar27 = (this->m_rep0_len2_plus_stats).m_max_val;
        uVar24 = -(ulong)(dVar16 < dVar15);
        uVar25 = -(ulong)(dVar27 < dVar15);
        uVar23 = (ulong)dVar15 & uVar25;
        auVar34._0_8_ = ~uVar24 & (ulong)dVar15;
        auVar34._8_8_ = ~uVar25 & (ulong)dVar27;
        auVar12._8_4_ = (int)uVar23;
        auVar12._0_8_ = (ulong)dVar16 & uVar24;
        auVar12._12_4_ = (int)(uVar23 >> 0x20);
        (this->m_rep0_len2_plus_stats).m_min_val = (double)SUB168(auVar34 | auVar12,0);
        (this->m_rep0_len2_plus_stats).m_max_val = (double)SUB168(auVar34 | auVar12,8);
      }
    }
  }
  else {
    this->m_full_match_stats[(int)uVar19].m_num = this->m_full_match_stats[(int)uVar19].m_num + 1;
    this->m_full_match_stats[(int)uVar19].m_total =
         this->m_full_match_stats[(int)uVar19].m_total + dVar15;
    this->m_full_match_stats[(int)uVar19].m_total2 =
         dVar35 + this->m_full_match_stats[(int)uVar19].m_total2;
    pdVar2 = &this->m_full_match_stats[(int)uVar19].m_min_val;
    dVar16 = *pdVar2;
    dVar27 = pdVar2[1];
    uVar25 = -(ulong)(dVar16 < dVar15);
    uVar26 = -(ulong)(dVar27 < dVar15);
    uVar24 = (ulong)dVar15 & uVar26;
    auVar31._0_8_ = ~uVar25 & (ulong)dVar15;
    auVar31._8_8_ = ~uVar26 & (ulong)dVar27;
    auVar9._8_4_ = (int)uVar24;
    auVar9._0_8_ = (ulong)dVar16 & uVar25;
    auVar9._12_4_ = (int)(uVar24 >> 0x20);
    this->m_full_match_stats[(int)uVar19].m_min_val = (double)SUB168(auVar31 | auVar9,0);
    this->m_full_match_stats[(int)uVar19].m_max_val = (double)SUB168(auVar31 | auVar9,8);
    if (uVar23 == 2) {
      if (lzdec->m_dist < 0x201) {
        this->m_total_near_len2_matches = this->m_total_near_len2_matches + 1;
      }
      else {
        this->m_total_far_len2_matches = this->m_total_far_len2_matches + 1;
      }
      uVar20 = lzdec->m_dist;
      if (lzdec->m_dist < (int)this->m_max_len2_dist) {
        uVar20 = this->m_max_len2_dist;
      }
      this->m_max_len2_dist = uVar20;
    }
  }
  return;
}

Assistant:

void lzcompressor::coding_stats::update(const lzdecision& lzdec, const state& cur_state, const search_accelerator& dict, bit_cost_t cost)
   {
      m_total_bytes += lzdec.get_len();
      m_total_contexts++;

      float cost_in_bits = cost / (float)cBitCostScale;
      LZHAM_ASSERT(cost_in_bits > 0.0f);
      m_total_cost += cost_in_bits;

      m_context_stats.update(cost_in_bits);

      //uint match_pred = cur_state.get_pred_char(dict, lzdec.m_pos, 1);
      uint is_match_model_index = LZHAM_IS_MATCH_MODEL_INDEX(cur_state.m_cur_state);

      if (lzdec.m_len == 0)
      {
         float match_bit_cost = cur_state.m_is_match_model[is_match_model_index].get_cost(0) / (float)cBitCostScale;

         m_total_is_match0_bits_cost += match_bit_cost;
         m_total_match_bits_cost += match_bit_cost;
         m_worst_match_bits_cost = math::maximum<double>(m_worst_match_bits_cost, static_cast<double>(match_bit_cost));
         m_total_nonmatches++;

         if (cur_state.m_cur_state < CLZBase::cNumLitStates)
         {
            m_lit_stats.update(cost_in_bits);
         }
         else
         {
            m_delta_lit_stats.update(cost_in_bits);
         }
      }
      else if (lzdec.m_len <= CLZBase::cMaxMatchLen)
      {
         const uint match_len = lzdec.get_len();

         {
            uint match_dist = lzdec.get_match_dist(cur_state);

            uint cur_lookahead_size = dict.get_lookahead_size();

            uint actual_match_len = dict.get_match_len(0, match_dist, LZHAM_MIN(cur_lookahead_size, static_cast<uint>(CLZBase::cMaxMatchLen)));
            LZHAM_VERIFY(match_len <= actual_match_len);

            m_total_truncated_matches += match_len < actual_match_len;
            m_match_truncation_len_hist[math::maximum<int>(0, actual_match_len - match_len)]++;

            uint type_index = 4;
            if (!lzdec.is_full_match())
            {
               LZHAM_ASSUME(CLZBase::cMatchHistSize == 4);
               type_index = -lzdec.m_dist - 1;
            }

            if (actual_match_len > match_len)
            {
               m_match_truncation_hist[match_len]++;

               m_match_type_truncation_hist[cur_state.m_cur_state][type_index]++;
            }
            else
            {
               m_match_type_was_not_truncated_hist[cur_state.m_cur_state][type_index]++;
            }
         }

         float match_bit_cost = cur_state.m_is_match_model[is_match_model_index].get_cost(1) / (float)cBitCostScale;
         m_total_is_match1_bits_cost += match_bit_cost;
         m_total_match_bits_cost += match_bit_cost;
         m_worst_match_bits_cost = math::maximum<double>(m_worst_match_bits_cost, static_cast<double>(match_bit_cost));
         m_total_matches++;

         if (lzdec.m_dist < 0)
         {
            // rep match
            int match_hist_index = -lzdec.m_dist - 1;
            LZHAM_ASSERT(match_hist_index < CLZBase::cMatchHistSize);

            m_rep_stats[match_hist_index].update(cost_in_bits);

            if (!match_hist_index)
            {
               // rep0 match
               if (lzdec.m_len == 1)
               {
                  m_rep0_len1_stats.update(cost_in_bits);
               }
               else
               {
                  m_rep0_len2_plus_stats.update(cost_in_bits);
               }
            }
         }
         else
         {
            m_full_match_stats[math::minimum<int>(cMaxMatchLen, match_len)].update(cost_in_bits);

            if (match_len == 2)
            {
               if (lzdec.m_dist <= 512)
                  m_total_near_len2_matches++;
               else
                  m_total_far_len2_matches++;

               m_max_len2_dist = LZHAM_MAX((int)m_max_len2_dist, lzdec.m_dist);
            }
         }
      }
      else
      {
         // TODO: Handle huge matches.
      }
   }